

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument.cpp
# Opt level: O3

void __thiscall sf2cute::SFInstrument::SetBackwardReferences(SFInstrument *this)

{
  pointer puVar1;
  SFInstrumentZone *this_00;
  unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_> *zone;
  pointer puVar2;
  
  puVar1 = (this->zones_).
           super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->zones_).
                super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    SFInstrumentZone::set_parent_instrument
              ((puVar2->_M_t).
               super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
               ._M_t.
               super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
               .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl,this);
  }
  this_00 = (this->global_zone_)._M_t.
            super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
            ._M_t.
            super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
            .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl;
  if (this_00 != (SFInstrumentZone *)0x0) {
    SFInstrumentZone::set_parent_instrument(this_00,this);
    return;
  }
  return;
}

Assistant:

void SFInstrument::SetBackwardReferences() noexcept {
  // Update the instrument zones.
  for (const auto & zone : zones_) {
    zone->set_parent_instrument(*this);
  }

  // Update the global instrument zone.
  if (has_global_zone()) {
    global_zone_->set_parent_instrument(*this);
  }
}